

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resize.c
# Opt level: O0

void highbd_resize_plane(uint8_t *input,int height,int width,int in_stride,uint8_t *output,
                        int height2,int width2,int out_stride,int bd)

{
  void *pvVar1;
  void *pvVar2;
  uint16_t *arr;
  uint16_t *arr_00;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  undefined8 in_RDI;
  long in_R8;
  int in_R9D;
  uint16_t *unaff_retaddr;
  int in_stack_00000008;
  int in_stack_0000000c;
  uint16_t *arrbuf2;
  uint16_t *arrbuf;
  uint16_t *tmpbuf;
  uint16_t *intbuf;
  int i;
  undefined4 in_stack_ffffffffffffffb0;
  int iVar3;
  int local_28;
  
  pvVar1 = aom_malloc(0x6e7441);
  iVar3 = in_ESI;
  if (in_ESI < in_EDX) {
    iVar3 = in_EDX;
  }
  pvVar2 = aom_malloc(0x6e7471);
  arr = (uint16_t *)aom_malloc(0x6e7483);
  arr_00 = (uint16_t *)aom_malloc(0x6e7495);
  if ((((pvVar1 != (void *)0x0) && (pvVar2 != (void *)0x0)) && (arr != (uint16_t *)0x0)) &&
     (arr_00 != (uint16_t *)0x0)) {
    for (local_28 = 0; local_28 < in_ESI; local_28 = local_28 + 1) {
      highbd_resize_multistep
                ((uint16_t *)CONCAT44(arrbuf2._4_4_,(int)arrbuf2),in_stack_0000000c,unaff_retaddr,
                 (int)((ulong)in_RDI >> 0x20),(uint16_t *)CONCAT44(in_ESI,in_EDX),in_ECX);
    }
    for (local_28 = 0; local_28 < in_stack_00000008; local_28 = local_28 + 1) {
      highbd_fill_col_to_arr
                ((uint16_t *)((long)pvVar1 + (long)local_28 * 2),in_stack_00000008,in_ESI,arr);
      highbd_resize_multistep
                ((uint16_t *)CONCAT44(arrbuf2._4_4_,(int)arrbuf2),in_stack_0000000c,unaff_retaddr,
                 (int)((ulong)in_RDI >> 0x20),(uint16_t *)CONCAT44(in_ESI,in_EDX),in_ECX);
      highbd_fill_arr_to_col((uint16_t *)((in_R8 + local_28) * 2),(int)arrbuf2,in_R9D,arr_00);
    }
  }
  aom_free((void *)CONCAT44(iVar3,in_stack_ffffffffffffffb0));
  aom_free((void *)CONCAT44(iVar3,in_stack_ffffffffffffffb0));
  aom_free((void *)CONCAT44(iVar3,in_stack_ffffffffffffffb0));
  aom_free((void *)CONCAT44(iVar3,in_stack_ffffffffffffffb0));
  return;
}

Assistant:

static void highbd_resize_plane(const uint8_t *input, int height, int width,
                                int in_stride, uint8_t *output, int height2,
                                int width2, int out_stride, int bd) {
  int i;
  uint16_t *intbuf = (uint16_t *)aom_malloc(sizeof(uint16_t) * width2 * height);
  uint16_t *tmpbuf =
      (uint16_t *)aom_malloc(sizeof(uint16_t) * AOMMAX(width, height));
  uint16_t *arrbuf = (uint16_t *)aom_malloc(sizeof(uint16_t) * height);
  uint16_t *arrbuf2 = (uint16_t *)aom_malloc(sizeof(uint16_t) * height2);
  if (intbuf == NULL || tmpbuf == NULL || arrbuf == NULL || arrbuf2 == NULL)
    goto Error;
  for (i = 0; i < height; ++i) {
    highbd_resize_multistep(CONVERT_TO_SHORTPTR(input + in_stride * i), width,
                            intbuf + width2 * i, width2, tmpbuf, bd);
  }
  for (i = 0; i < width2; ++i) {
    highbd_fill_col_to_arr(intbuf + i, width2, height, arrbuf);
    highbd_resize_multistep(arrbuf, height, arrbuf2, height2, tmpbuf, bd);
    highbd_fill_arr_to_col(CONVERT_TO_SHORTPTR(output + i), out_stride, height2,
                           arrbuf2);
  }

Error:
  aom_free(intbuf);
  aom_free(tmpbuf);
  aom_free(arrbuf);
  aom_free(arrbuf2);
}